

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter>::
Read(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_ExprPrinter> *this,
    BinaryReader<mp::internal::EndiannessConverter> *bound_reader)

{
  NLHeader *pNVar1;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar2;
  byte *pbVar3;
  ExprPrinter *pEVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  bool bVar14;
  bool bVar15;
  NumericExpr expr;
  ArgList local_f0;
  BinaryReader<mp::internal::EndiannessConverter> *local_e0;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string local_b0;
  NumericExpr local_90;
  NumericExpr local_70;
  LogicalExpr local_50;
  
  bVar14 = bound_reader == (BinaryReader<mp::internal::EndiannessConverter> *)0x0;
  pNVar1 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  local_e0 = bound_reader;
  do {
    pBVar2 = this->reader_;
    pbVar3 = (byte *)(pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = (char *)pbVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = (char *)(pbVar3 + 1);
    bVar8 = *pbVar3;
    if (0x61 < bVar8) {
      if (bVar8 < 0x6b) {
        if (bVar8 == 0x62) {
          if (bVar14 == false) {
            if (local_e0 == (BinaryReader<mp::internal::EndiannessConverter> *)0x0) {
              local_d8 = (undefined1  [16])0x0;
              local_f0.types_ = 0;
              local_f0.field_1.values_ = (Value *)local_d8;
              BinaryReaderBase::ReportError
                        (&pBVar2->super_BinaryReaderBase,(CStringRef)0x139e71,&local_f0);
            }
            pBVar2 = this->reader_;
            pcVar5 = (local_e0->super_BinaryReaderBase).super_ReaderBase.ptr_;
            pcVar6 = (local_e0->super_BinaryReaderBase).super_ReaderBase.start_;
            pcVar7 = (local_e0->super_BinaryReaderBase).super_ReaderBase.token_;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.end_ =
                 (local_e0->super_BinaryReaderBase).super_ReaderBase.end_;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar7;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5;
            (pBVar2->super_BinaryReaderBase).super_ReaderBase.start_ = pcVar6;
            std::__cxx11::string::_M_assign
                      ((string *)&(pBVar2->super_BinaryReaderBase).super_ReaderBase.name_);
            bVar15 = true;
            local_e0 = (BinaryReader<mp::internal::EndiannessConverter> *)0x0;
          }
          else {
            NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
            ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::VarHandler>
                      ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                        *)this);
            bVar8 = (byte)this->flags_ & 1;
            bVar15 = bVar8 == 0;
            bVar14 = (bool)(bVar14 & -bVar8);
          }
          goto LAB_00129a5b;
        }
        if (bVar8 != 100) goto switchD_001295da_caseD_44;
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
        ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::AlgebraicConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                    *)this);
      }
      else if (bVar8 == 0x6b) {
        ReadColumnSizes<true>(this);
      }
      else if (bVar8 == 0x72) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::AlgebraicConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                    *)this);
      }
      else {
        if (bVar8 != 0x78) goto switchD_001295da_caseD_44;
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
        ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                    *)this);
      }
      goto LAB_00129a58;
    }
    switch(bVar8) {
    case 0x43:
      iVar11 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.
                             num_algebraic_cons);
      pBVar2 = this->reader_;
      pEVar4 = this->handler_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadNumericExpr_abi_cxx11_
                (&local_90,
                 (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this,*pcVar5,true);
      ExprPrinter::OnAlgebraicCon(pEVar4,iVar11,&local_90);
      bVar15 = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00129a5b;
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x49:
    case 0x4d:
    case 0x4e:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x54:
    case 0x55:
switchD_001295da_caseD_44:
      local_d8 = (undefined1  [16])0x0;
      local_f0.types_ = 0;
      local_f0.field_1.values_ = (Value *)local_d8;
      BinaryReaderBase::ReportError(&pBVar2->super_BinaryReaderBase,(CStringRef)0x139e9b,&local_f0);
      break;
    case 0x46:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
      uVar10 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      if (1 < uVar10) {
        local_d8 = (undefined1  [16])0x0;
        local_f0.types_ = 0;
        local_f0.field_1.values_ = (Value *)local_d8;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x139e47,&local_f0);
      }
      BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>(this->reader_);
      BinaryReader<mp::internal::EndiannessConverter>::ReadString(this->reader_);
      break;
    case 0x47:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::ObjHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this);
      break;
    case 0x4a:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this);
      break;
    case 0x4b:
      ReadColumnSizes<false>(this);
      break;
    case 0x4c:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadLogicalExpr_abi_cxx11_
                (&local_50,
                 (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this);
      bVar15 = true;
      uVar12 = local_50.field_2._M_allocated_capacity;
      _Var13._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00129959:
        bVar15 = true;
        operator_delete(_Var13._M_p,uVar12 + 1);
      }
      goto LAB_00129a5b;
    case 0x4f:
      iVar11 = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
      iVar9 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadNumericExpr_abi_cxx11_
                ((NumericExpr *)local_d8,
                 (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this,*pcVar5,true);
      pEVar4 = this->handler_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_d8._0_8_,(pointer)(local_d8._0_8_ + local_d8._8_8_));
      ExprPrinter::OnObj(pEVar4,iVar11,(uint)(iVar9 != 0),&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._0_8_ != &local_c8) {
        operator_delete((void *)local_d8._0_8_,local_c8._M_allocated_capacity + 1);
      }
      bVar15 = true;
      goto LAB_00129a5b;
    case 0x53:
      uVar10 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(pBVar2);
      if (7 < (int)uVar10) {
        local_d8 = (undefined1  [16])0x0;
        local_f0.types_ = 0;
        local_f0.field_1.values_ = (Value *)local_d8;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x139e5d,&local_f0);
      }
      switch(uVar10 & 3) {
      case 0:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::VarHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                    *)this,uVar10);
        break;
      case 1:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::ConHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                    *)this,uVar10);
        break;
      case 2:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::ObjHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                    *)this,uVar10);
        break;
      case 3:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::ProblemHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                    *)this,uVar10);
      }
      break;
    case 0x56:
      ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
               this->num_vars_and_exprs_);
      iVar11 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
      if (iVar11 != 0) {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
        ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<std::__cxx11::string>,std::__cxx11::string>::LinearExprHandler>
                  ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                    *)this,iVar11);
      }
      pBVar2 = this->reader_;
      pcVar5 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar5;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar5 + 1;
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>::
      ReadNumericExpr_abi_cxx11_
                (&local_70,
                 (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,ExprPrinter>
                  *)this,*pcVar5,false);
      bVar15 = true;
      uVar12 = local_70.field_2._M_allocated_capacity;
      _Var13._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) goto LAB_00129959;
      goto LAB_00129a5b;
    default:
      if ((bVar8 != 0) || ((byte *)(pBVar2->super_BinaryReaderBase).super_ReaderBase.end_ != pbVar3)
         ) goto switchD_001295da_caseD_44;
      if (bVar14 != false) {
        local_d8 = (undefined1  [16])0x0;
        local_f0.types_ = 0;
        local_f0.field_1.values_ = (Value *)local_d8;
        BinaryReaderBase::ReportError
                  (&pBVar2->super_BinaryReaderBase,(CStringRef)0x139e87,&local_f0);
      }
      bVar15 = false;
      goto LAB_00129a5b;
    }
LAB_00129a58:
    bVar15 = true;
LAB_00129a5b:
    if (!bVar15) {
      return;
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}